

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O2

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec3f *pts,Vec2f *uvs,TGAImage *texture)

{
  float fVar1;
  long lVar2;
  vec<3,_float,_(glm::qualifier)0> A;
  TinyRender *pTVar3;
  Vec2f *pVVar4;
  TGAImage *this_00;
  int iVar5;
  int iVar6;
  TGAColor TVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  int j;
  vec<3,_float,_(glm::qualifier)0> *this_01;
  float fVar11;
  float fVar12;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar13;
  undefined8 extraout_XMM0_Qb;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_XMM7_Da;
  Vec3f VVar18;
  vec<3,_float,_(glm::qualifier)0> P;
  TGAColor c;
  Vec2f bboxmax;
  TGAColor local_c0;
  float local_b8;
  float fStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a0;
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  undefined8 local_80;
  TinyRender *local_78;
  Vec2f *local_70;
  TGAImage *local_68;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_60;
  float fStack_5c;
  undefined1 local_58 [16];
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_48;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_44;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_40;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_3c;
  
  local_70 = uvs;
  local_68 = texture;
  TGAImage::get_width(*(TGAImage **)(this + 8));
  iVar5 = TGAImage::get_width(*(TGAImage **)(this + 8));
  iVar6 = TGAImage::get_height(*(TGAImage **)(this + 8));
  local_a0._0_4_ = (float)(iVar5 + -1);
  local_a0._4_4_ = (float)(iVar6 + -1);
  local_80._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_80._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  iVar5 = TGAImage::get_width(*(TGAImage **)(this + 8));
  local_78 = this;
  iVar6 = TGAImage::get_height(*(TGAImage **)(this + 8));
  local_60.x = (float)(iVar5 + -1);
  fStack_5c = (float)(iVar6 + -1);
  for (local_98 = 0; this_00 = local_68, pVVar4 = local_70, pTVar3 = local_78, local_98 != 3;
      local_98 = local_98 + 1) {
    this_01 = pts + local_98;
    for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
      pfVar8 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                         ((vec<2,_float,_(glm::qualifier)0> *)&local_a0,iVar5);
      pfVar9 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](this_01,iVar5);
      local_b8 = *pfVar9;
      if (*pfVar8 <= *pfVar9) {
        local_b8 = *pfVar8;
      }
      if (local_b8 <= 0.0) {
        local_b8 = 0.0;
      }
      pfVar8 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                         ((vec<2,_float,_(glm::qualifier)0> *)&local_a0,iVar5);
      *pfVar8 = local_b8;
      pfVar8 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                         ((vec<2,_float,_(glm::qualifier)0> *)&local_60,iVar5);
      pfVar9 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                         ((vec<2,_float,_(glm::qualifier)0> *)&local_80,iVar5);
      pfVar10 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](this_01,iVar5);
      local_b8 = *pfVar10;
      if (*pfVar10 <= *pfVar9) {
        local_b8 = *pfVar9;
      }
      if (*pfVar8 <= local_b8) {
        local_b8 = *pfVar8;
      }
      pfVar8 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                         ((vec<2,_float,_(glm::qualifier)0> *)&local_80,iVar5);
      *pfVar8 = local_b8;
    }
  }
  uStack_b0 = 0;
  uStack_ac = 0;
  for (local_b8 = (float)(int)(local_a0._0_4_ + 0.5); local_b8 <= local_80._0_4_;
      local_b8 = local_b8 + 1.0) {
    fStack_b4 = (float)(int)(local_a0._4_4_ + 0.5);
    while (fStack_b4 <= local_80._4_4_) {
      local_98 = CONCAT44(fStack_b4,fStack_b4);
      A.field_0 = pts->field_0;
      A.field_1 = pts->field_1;
      A.field_2 = pts->field_2;
      P.field_1.y = fStack_b4;
      P.field_0.x = local_b8;
      P.field_2 = in_XMM7_Da;
      fStack_90 = fStack_b4;
      fStack_8c = fStack_b4;
      VVar18 = barycentric<3ul>(A,pts[1],pts[2],P);
      aVar14 = VVar18.field_2;
      aVar13 = VVar18.field_1;
      if (((0.0 <= VVar18.field_0.x) && (0.0 <= aVar13.y)) && (0.0 <= aVar14.z)) {
        fVar11 = pts[2].field_2.z * aVar14.z +
                 (pts->field_2).z * VVar18.field_0.x + pts[1].field_2.z * aVar13.y;
        lVar2 = *(long *)(pTVar3 + 0x10);
        local_58._8_4_ = (int)extraout_XMM0_Qb;
        local_58._0_8_ = VVar18._0_8_;
        local_58._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        local_48 = aVar13;
        aStack_44 = aVar13;
        aStack_40 = aVar13;
        aStack_3c = aVar13;
        iVar5 = TGAImage::get_width(*(TGAImage **)(pTVar3 + 8));
        pfVar8 = (float *)(lVar2 + (long)(int)((float)iVar5 * (float)local_98 + local_b8) * 4);
        if (fVar11 < *pfVar8 || fVar11 == *pfVar8) {
          lVar2 = *(long *)(pTVar3 + 0x10);
          iVar5 = TGAImage::get_width(*(TGAImage **)(pTVar3 + 8));
          *(float *)(lVar2 + (long)(int)((float)iVar5 * (float)local_98 + local_b8) * 4) = fVar11;
          fVar12 = (pVVar4->field_0).x * (float)local_58._0_4_;
          fVar15 = (float)local_58._0_4_ * (pVVar4->field_1).y;
          fVar16 = pVVar4[1].field_0.x * local_48.y;
          fVar17 = local_48.y * pVVar4[1].field_1.y;
          fVar11 = pVVar4[2].field_0.x;
          fVar1 = pVVar4[2].field_1.y;
          iVar5 = TGAImage::get_width(this_00);
          iVar6 = TGAImage::get_height(this_00);
          TVar7 = TGAImage::get(this_00,(int)((float)(iVar5 + -1) *
                                              (fVar11 * aVar14.z + fVar16 + fVar12) + 0.5),
                                (int)((float)(iVar6 + -1) * (aVar14.z * fVar1 + fVar17 + fVar15) +
                                     0.5));
          local_c0.bgra = TVar7.bgra;
          local_c0.bytespp = TVar7.bytespp;
          TGAImage::set(*(TGAImage **)(pTVar3 + 8),(int)local_b8,(int)(float)local_98,&local_c0);
        }
      }
      fStack_b4 = (float)local_98 + 1.0;
    }
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec3f* pts, Vec2f* uvs, TGAImage* texture) {
  int width = mImage->get_width();

  Vec2i ptis[3];
  for (size_t i = 0; i < 3; i++) {
    ptis[i][0] = int(pts[i][0] + .5f);
    ptis[i][1] = int(pts[i][1] + .5f);
  }

  Vec2f bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2f bboxmax(0, 0);
  Vec2f clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0.f, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = int(bboxmin.x + .5f); p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = int(bboxmin.y + .5f); p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      if (mZBuffer[int(p.x + p.y * mImage->get_width())] < pz) continue;

      mZBuffer[int(p.x + p.y * mImage->get_width())] = pz;
      /**
       * Calculate texture color
       **/
      Vec2f uvf =
          uvs[0] * bc_screen[0] + uvs[1] * bc_screen[1] + uvs[2] * bc_screen[2];
      TGAColor c =
          texture->get(int((texture->get_width() - 1) * uvf[0] + .5f),
                       int((texture->get_height() - 1) * uvf[1] + .5f));
      mImage->set(p[0], p[1], c);
    }
  }
}